

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O2

void __thiscall mprpc::MpRpcClient::MpRpcClient(MpRpcClient *this,shared_ptr<Connection> *conn)

{
  rep rVar1;
  Closure local_60;
  _Bind<void_(mprpc::MpRpcClient::*(mprpc::MpRpcClient_*))()> local_40;
  
  (this->super_Connection_Callback)._vptr_Connection_Callback =
       (_func_int **)&PTR___cxa_pure_virtual_0016d5d8;
  loop::MsgLoopRun::MsgLoopRun(&this->super_MsgLoopRun);
  (this->super_Connection_Callback)._vptr_Connection_Callback = (_func_int **)&PTR_on_recv_0016d4d8;
  (this->super_MsgLoopRun)._vptr_MsgLoopRun = (_func_int **)&PTR__MpRpcClient_0016d510;
  (this->m_addr)._M_dataplus._M_p = (pointer)&(this->m_addr).field_2;
  (this->m_addr)._M_string_length = 0;
  (this->m_addr).field_2._M_local_buf[0] = '\0';
  std::__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_conn).super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>,
             &conn->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>);
  this->m_callback = (MpRpcClient_Callback *)0x0;
  this->m_connected = false;
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->m_last_hb_rsp_time).__d.__r = rVar1;
  (this->m_last_hb_time).__d.__r = 0;
  (this->m_on_rsp_map)._M_h._M_buckets = &(this->m_on_rsp_map)._M_h._M_single_bucket;
  (this->m_on_rsp_map)._M_h._M_bucket_count = 1;
  (this->m_on_rsp_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_on_rsp_map)._M_h._M_element_count = 0;
  (this->m_on_rsp_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_on_rsp_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_on_rsp_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  LOCK();
  (this->m_cur_callid).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  local_40._M_f = (offset_in_MpRpcClient_to_subr)on_check_timer;
  local_40._8_8_ = 0;
  local_40._M_bound_args.super__Tuple_impl<0UL,_mprpc::MpRpcClient_*>.
  super__Head_base<0UL,_mprpc::MpRpcClient_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_mprpc::MpRpcClient_*>)(_Tuple_impl<0UL,_mprpc::MpRpcClient_*>)this;
  std::function<void()>::
  function<std::_Bind<void(mprpc::MpRpcClient::*(mprpc::MpRpcClient*))()>,void>
            ((function<void()> *)&local_60,&local_40);
  loop::MessageLoop::post_delayed_task(&(this->super_MsgLoopRun).m_msg_loop,&local_60,100);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  return;
}

Assistant:

MpRpcClient::MpRpcClient(shared_ptr<Connection> conn)
        : m_conn(conn)
        , m_callback(nullptr)
        , m_connected(false)
        , m_last_hb_rsp_time(system_clock::now())
        //, m_last_hb_time
    {
        m_cur_callid = 0;

        msg_loop().post_delayed_task(bind(&MpRpcClient::on_check_timer, this), 100);
    }